

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredFBO.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderFramebufferTextureInvalidValue::iterate
          (GeometryShaderFramebufferTextureInvalidValue *this)

{
  int iVar1;
  deUint32 dVar2;
  NotSupportedError *this_00;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *this_01;
  MessageBuilder *this_02;
  MessageBuilder local_1d8;
  ulong local_58;
  size_t i;
  GLuint invalidValue;
  GLuint errorEnum;
  Functions *gl;
  byte local_29;
  undefined8 uStack_28;
  bool result;
  size_t numberOfEnums;
  GLuint fbEnums [3];
  GeometryShaderFramebufferTextureInvalidValue *this_local;
  
  stack0xffffffffffffffe4 = 0x8ca800008ca9;
  fbEnums[0] = 0x8d40;
  uStack_28 = 3;
  local_29 = 0;
  fbEnums._4_8_ = this;
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
               ,0x37e);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  _invalidValue = CONCAT44(extraout_var,iVar1);
  (**(code **)(_invalidValue + 0x6d0))(1,&this->m_fbo_id);
  dVar2 = (**(code **)(_invalidValue + 0x800))();
  glu::checkError(dVar2,"glGenFramebuffers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,900);
  i._0_4_ = 1;
  local_58 = 0;
  do {
    if (2 < local_58) {
LAB_01598086:
      if ((local_29 & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      return STOP;
    }
    (**(code **)(_invalidValue + 0x78))
              (*(undefined4 *)((long)&numberOfEnums + local_58 * 4 + 4),this->m_fbo_id);
    dVar2 = (**(code **)(_invalidValue + 0x800))();
    glu::checkError(dVar2,"glBindFramebuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                    ,0x38c);
    (**(code **)(_invalidValue + 0x690))
              (*(undefined4 *)((long)&numberOfEnums + local_58 * 4 + 4),0x8ce0,(int)i,1);
    i._4_4_ = (**(code **)(_invalidValue + 0x800))();
    i._0_4_ = (int)i * 10;
    if (i._4_4_ != 0x501) {
      local_29 = 0;
      this_01 = tcu::TestContext::getLog
                          ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_1d8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      this_02 = tcu::MessageBuilder::operator<<
                          (&local_1d8,
                           (char (*) [53])"Error different than GL_INVALID_VALUE was generated.");
      tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1d8);
      goto LAB_01598086;
    }
    local_29 = 1;
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderFramebufferTextureInvalidValue::iterate()
{
	const glw::GLuint fbEnums[]		= { GL_DRAW_FRAMEBUFFER, GL_READ_FRAMEBUFFER, GL_FRAMEBUFFER };
	const size_t	  numberOfEnums = sizeof(fbEnums) / sizeof(fbEnums[0]);
	bool			  result		= false;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genFramebuffers(1, &m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers() call failed.");

	glw::GLuint errorEnum;
	glw::GLuint invalidValue = 1;

	for (size_t i = 0; i < numberOfEnums; ++i)
	{
		gl.bindFramebuffer(fbEnums[i], m_fbo_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed.");

		gl.framebufferTexture(fbEnums[i], GL_COLOR_ATTACHMENT0, invalidValue /* texture */, 1 /* level */);
		errorEnum = gl.getError();

		invalidValue *= 10;

		if (errorEnum == GL_INVALID_VALUE)
		{
			result = true;
		}
		else
		{
			result = false;

			m_testCtx.getLog() << tcu::TestLog::Message << "Error different than GL_INVALID_VALUE was generated."
							   << tcu::TestLog::EndMessage;

			break;
		}
	}

	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}